

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lex.c
# Opt level: O3

void lex_number(LexState *ls,TValue *tv)

{
  byte *pbVar1;
  uint8_t *p;
  lua_State *L;
  TValue *pTVar2;
  uint64_t uVar3;
  uint uVar4;
  uint uVar5;
  StrScanFmt SVar6;
  char *pcVar7;
  GCcdata *cd;
  uint uVar8;
  uint uVar9;
  
  uVar9 = ls->c;
  uVar4 = uVar9;
  uVar8 = 0x65;
  if (uVar9 == 0x30) {
    pcVar7 = (ls->sb).w;
    if (*(int *)&(ls->sb).e == (int)pcVar7) {
      pcVar7 = lj_buf_more2(&ls->sb,1);
    }
    *pcVar7 = '0';
    (ls->sb).w = pcVar7 + 1;
    pbVar1 = (byte *)ls->p;
    if (pbVar1 < ls->pe) {
      ls->p = (char *)(pbVar1 + 1);
      uVar4 = (uint)*pbVar1;
    }
    else {
      uVar4 = lex_more(ls);
    }
    ls->c = uVar4;
    uVar8 = 0x65;
    if ((uVar4 & 0xffffffdf) == 0x58) {
      uVar8 = 0x70;
    }
  }
  while (((uVar4 == 0x2e || ((char)""[(long)(int)uVar4 + 1] < '\0')) ||
         (((uVar4 == 0x2d || (uVar4 == 0x2b)) && ((uVar9 | 0x20) == uVar8))))) {
    pcVar7 = (ls->sb).w;
    if (*(int *)&(ls->sb).e == (int)pcVar7) {
      pcVar7 = lj_buf_more2(&ls->sb,1);
    }
    *pcVar7 = (char)uVar4;
    (ls->sb).w = pcVar7 + 1;
    pbVar1 = (byte *)ls->p;
    if (pbVar1 < ls->pe) {
      ls->p = (char *)(pbVar1 + 1);
      uVar5 = (uint)*pbVar1;
    }
    else {
      uVar5 = lex_more(ls);
    }
    ls->c = uVar5;
    uVar9 = uVar4;
    uVar4 = uVar5;
  }
  pcVar7 = (ls->sb).w;
  if (*(int *)&(ls->sb).e == (int)pcVar7) {
    pcVar7 = lj_buf_more2(&ls->sb,1);
  }
  *pcVar7 = '\0';
  (ls->sb).w = pcVar7 + 1;
  p = (uint8_t *)(ls->sb).b;
  SVar6 = lj_strscan_scan(p,~(uint)p + (int)(pcVar7 + 1),tv,0xe);
  if (SVar6 != STRSCAN_NUM) {
    if (SVar6 != STRSCAN_ERROR) {
      L = ls->L;
      if (*(long *)((L->glref).ptr64 + 0x180) == 0) {
        pTVar2 = L->top;
        uVar3 = (L->stack).ptr64;
        luaopen_ffi(L);
        L->top = (TValue *)((long)pTVar2 + ((L->stack).ptr64 - uVar3));
      }
      if (SVar6 == STRSCAN_IMAG) {
        cd = (GCcdata *)lj_mem_newgco(L,0x20);
        cd->gct = '\n';
        cd->ctypeid = 0x10;
        cd[1].nextgc.gcptr64 = 0;
        *(TValue *)&cd[1].marked = *tv;
      }
      else {
        cd = (GCcdata *)lj_mem_newgco(L,0x18);
        cd->gct = '\n';
        cd->ctypeid = (SVar6 != STRSCAN_I64) + 0xb;
        *(TValue *)(cd + 1) = *tv;
      }
      lj_parse_keepcdata(ls,tv,cd);
      return;
    }
    lj_lex_error(ls,0x11e,LJ_ERR_XNUMBER);
  }
  return;
}

Assistant:

static void lex_number(LexState *ls, TValue *tv)
{
  StrScanFmt fmt;
  LexChar c, xp = 'e';
  lj_assertLS(lj_char_isdigit(ls->c), "bad usage");
  if ((c = ls->c) == '0' && (lex_savenext(ls) | 0x20) == 'x')
    xp = 'p';
  while (lj_char_isident(ls->c) || ls->c == '.' ||
	 ((ls->c == '-' || ls->c == '+') && (c | 0x20) == xp)) {
    c = ls->c;
    lex_savenext(ls);
  }
  lex_save(ls, '\0');
  fmt = lj_strscan_scan((const uint8_t *)ls->sb.b, sbuflen(&ls->sb)-1, tv,
	  (LJ_DUALNUM ? STRSCAN_OPT_TOINT : STRSCAN_OPT_TONUM) |
	  (LJ_HASFFI ? (STRSCAN_OPT_LL|STRSCAN_OPT_IMAG) : 0));
  if (LJ_DUALNUM && fmt == STRSCAN_INT) {
    setitype(tv, LJ_TISNUM);
  } else if (fmt == STRSCAN_NUM) {
    /* Already in correct format. */
#if LJ_HASFFI
  } else if (fmt != STRSCAN_ERROR) {
    lua_State *L = ls->L;
    GCcdata *cd;
    lj_assertLS(fmt == STRSCAN_I64 || fmt == STRSCAN_U64 || fmt == STRSCAN_IMAG,
		"unexpected number format %d", fmt);
    ctype_loadffi(L);
    if (fmt == STRSCAN_IMAG) {
      cd = lj_cdata_new_(L, CTID_COMPLEX_DOUBLE, 2*sizeof(double));
      ((double *)cdataptr(cd))[0] = 0;
      ((double *)cdataptr(cd))[1] = numV(tv);
    } else {
      cd = lj_cdata_new_(L, fmt==STRSCAN_I64 ? CTID_INT64 : CTID_UINT64, 8);
      *(uint64_t *)cdataptr(cd) = tv->u64;
    }
    lj_parse_keepcdata(ls, tv, cd);
#endif
  } else {
    lj_assertLS(fmt == STRSCAN_ERROR,
		"unexpected number format %d", fmt);
    lj_lex_error(ls, TK_number, LJ_ERR_XNUMBER);
  }
}